

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall GlobOptBlockData::MakeLive(GlobOptBlockData *this,StackSym *sym,bool lossy)

{
  BVIndex i;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *pSVar4;
  SymID varSymId;
  bool lossy_local;
  StackSym *sym_local;
  GlobOptBlockData *this_local;
  
  if (sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x645,"(sym)","sym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this == (GlobOptBlockData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x646,"(this)","this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = StackSym::IsTypeSpec(sym);
  if (bVar2) {
    pSVar4 = StackSym::GetVarEquivSym(sym,this->globOpt->func);
    i = (pSVar4->super_Sym).m_id;
    bVar2 = StackSym::IsInt32(sym);
    if (bVar2) {
      BVSparse<Memory::JitArenaAllocator>::Set(this->liveInt32Syms,i);
      if (lossy) {
        BVSparse<Memory::JitArenaAllocator>::Set(this->liveLossyInt32Syms,i);
        return;
      }
      BVSparse<Memory::JitArenaAllocator>::Clear(this->liveLossyInt32Syms,i);
      return;
    }
    bVar2 = StackSym::IsFloat64(sym);
    if (bVar2) {
      BVSparse<Memory::JitArenaAllocator>::Set(this->liveFloat64Syms,i);
      return;
    }
  }
  BVSparse<Memory::JitArenaAllocator>::Set(this->liveVarSyms,(sym->super_Sym).m_id);
  return;
}

Assistant:

void
GlobOptBlockData::MakeLive(StackSym *sym, const bool lossy)
{
    Assert(sym);
    Assert(this);

    if(sym->IsTypeSpec())
    {
        const SymID varSymId = sym->GetVarEquivSym(this->globOpt->func)->m_id;
        if(sym->IsInt32())
        {
            this->liveInt32Syms->Set(varSymId);
            if(lossy)
            {
                this->liveLossyInt32Syms->Set(varSymId);
            }
            else
            {
                this->liveLossyInt32Syms->Clear(varSymId);
            }
            return;
        }

        if (sym->IsFloat64())
        {
            this->liveFloat64Syms->Set(varSymId);
            return;
        }
    }

    this->liveVarSyms->Set(sym->m_id);
}